

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void copyvalue(MOJOSHADER_effectValue *dst,MOJOSHADER_effectValue *src,MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  void *pvVar4;
  char *stringcopy;
  uint32 siz;
  int i;
  void *d_local;
  MOJOSHADER_malloc m_local;
  MOJOSHADER_effectValue *src_local;
  MOJOSHADER_effectValue *dst_local;
  
  if (src->name != (char *)0x0) {
    sVar2 = strlen(src->name);
    pcVar3 = (char *)(*m)((int)sVar2 + 1,d);
    strcpy(pcVar3,src->name);
    dst->name = pcVar3;
  }
  if (src->semantic != (char *)0x0) {
    sVar2 = strlen(src->semantic);
    pcVar3 = (char *)(*m)((int)sVar2 + 1,d);
    strcpy(pcVar3,src->semantic);
    dst->semantic = pcVar3;
  }
  copysymboltypeinfo(&dst->type,&src->type,m,d);
  dst->value_count = src->value_count;
  if (((((dst->type).parameter_class == MOJOSHADER_SYMCLASS_SCALAR) ||
       ((dst->type).parameter_class == MOJOSHADER_SYMCLASS_VECTOR)) ||
      ((dst->type).parameter_class == MOJOSHADER_SYMCLASS_MATRIX_ROWS)) ||
     (((dst->type).parameter_class == MOJOSHADER_SYMCLASS_MATRIX_COLUMNS ||
      ((dst->type).parameter_class == MOJOSHADER_SYMCLASS_STRUCT)))) {
    uVar1 = dst->value_count << 2;
    pvVar4 = (*m)(uVar1,d);
    (dst->field_4).values = pvVar4;
    memcpy((dst->field_4).values,(src->field_4).values,(ulong)uVar1);
  }
  else if ((dst->type).parameter_class == MOJOSHADER_SYMCLASS_OBJECT) {
    if ((((dst->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER) ||
        ((dst->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D)) ||
       (((dst->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D ||
        (((dst->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D ||
         ((dst->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)))))) {
      uVar1 = dst->value_count * 0x48;
      pvVar4 = (*m)(uVar1,d);
      (dst->field_4).values = pvVar4;
      memset((dst->field_4).values,0,(ulong)uVar1);
      for (stringcopy._4_4_ = 0; stringcopy._4_4_ < dst->value_count;
          stringcopy._4_4_ = stringcopy._4_4_ + 1) {
        *(undefined4 *)((long)(dst->field_4).values + (long)(int)stringcopy._4_4_ * 0x48) =
             *(undefined4 *)((long)(src->field_4).values + (long)(int)stringcopy._4_4_ * 0x48);
        copyvalue((MOJOSHADER_effectValue *)
                  ((long)(dst->field_4).values + (long)(int)stringcopy._4_4_ * 0x48 + 8),
                  (MOJOSHADER_effectValue *)
                  ((long)(src->field_4).values + (long)(int)stringcopy._4_4_ * 0x48 + 8),m,d);
      }
    }
    else {
      uVar1 = dst->value_count << 2;
      pvVar4 = (*m)(uVar1,d);
      (dst->field_4).values = pvVar4;
      memcpy((dst->field_4).values,(src->field_4).values,(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void copyvalue(MOJOSHADER_effectValue *dst,
               MOJOSHADER_effectValue *src,
               MOJOSHADER_malloc m,
               void *d)
{
    int i;
    uint32 siz = 0;
    char *stringcopy = NULL;

    COPY_STRING(name)
    COPY_STRING(semantic)
    copysymboltypeinfo(&dst->type, &src->type, m, d);
    dst->value_count = src->value_count;

    if (dst->type.parameter_class == MOJOSHADER_SYMCLASS_SCALAR
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_VECTOR
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_MATRIX_ROWS
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_MATRIX_COLUMNS
     || dst->type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
    {
        siz = dst->value_count * 4;
        dst->values = m(siz, d);
        // !!! FIXME: Out of memory check!
        memcpy(dst->values, src->values, siz);
    } // if
    else if (dst->type.parameter_class == MOJOSHADER_SYMCLASS_OBJECT)
    {
        if (dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D
         || dst->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            siz = dst->value_count * sizeof (MOJOSHADER_effectSamplerState);
            dst->values = m(siz, d);
            // !!! FIXME: Out of memory check!
            memset(dst->values, '\0', siz);
            for (i = 0; i < dst->value_count; i++)
            {
                dst->valuesSS[i].type = src->valuesSS[i].type;
                copyvalue(&dst->valuesSS[i].value,
                          &src->valuesSS[i].value,
                          m, d);
            } // for
        } // if
        else
        {
            siz = dst->value_count * 4;
            dst->values = m(siz, d);
            // !!! FIXME: Out of memory check!
            memcpy(dst->values, src->values, siz);
        } // else
    } // else if

}